

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

void __thiscall jsonnet::internal::Desugarer::desugar(Desugarer *this,AST **ast_,uint obj_level)

{
  Kind KVar1;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  bool bVar2;
  Binary *pBVar3;
  AST *pAVar4;
  LiteralString *pLVar5;
  Conditional *pCVar6;
  Index *pIVar7;
  Apply *pAVar8;
  Unary *pUVar9;
  LiteralNull *pLVar10;
  undefined8 uVar11;
  Var *pVVar12;
  reference pBVar13;
  Function *pFVar14;
  long lVar15;
  ostream *this_00;
  void *this_01;
  int in_EDX;
  Desugarer *in_RSI;
  ArrayComprehension *in_stack_00000298;
  Desugarer *in_stack_000002a0;
  Unary *ast_23;
  SuperIndex *ast_22;
  Parens *ast_21;
  ObjectComprehensionSimple *ast_20;
  ObjectComprehension *ast_19;
  Object *ast_18;
  AST *assert;
  iterator __end24_1;
  iterator __begin24_1;
  ASTs *__range24_1;
  Field *field;
  iterator __end24;
  iterator __begin24;
  Fields *__range24;
  DesugaredObject *ast_17;
  LiteralString *ast_16;
  Bind *bind_1;
  iterator __end19_1;
  iterator __begin19_1;
  Binds *__range19_1;
  Bind *bind;
  iterator __end19;
  iterator __begin19;
  Binds *__range19;
  Local *ast_15;
  Index *ast_14;
  InSuper *ast_13;
  AST *file_2;
  Importbin *ast_12;
  AST *file_1;
  Importstr *ast_11;
  AST *file;
  Import *ast_10;
  Function *ast_9;
  Error *ast_8;
  Dollar *ast_7;
  Conditional *ast_6;
  ArgParams args;
  AST *f_mod;
  bool invert;
  Binary *ast_5;
  AST *branch_false;
  Assert *ast_4;
  ComprehensionSpec *spec;
  iterator __end6;
  iterator __begin6;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range6;
  ArrayComprehension *ast_3;
  Element *el;
  iterator __end5;
  iterator __begin5;
  Elements *__range5;
  Array *ast_2;
  ApplyBrace *ast_1;
  ArgParam *arg;
  iterator __end3;
  iterator __begin3;
  ArgParams *__range3;
  Apply *ast;
  UString *in_stack_fffffffffffff6c8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff6d0;
  undefined1 *puVar16;
  LocationRange *in_stack_fffffffffffff6d8;
  string *in_stack_fffffffffffff6e0;
  undefined1 *puVar17;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *pvVar18;
  LocationRange *in_stack_fffffffffffff6e8;
  StaticError *in_stack_fffffffffffff6f0;
  undefined1 *this_02;
  LocationRange *in_stack_fffffffffffff6f8;
  LocationRange *in_stack_fffffffffffff700;
  iterator in_stack_fffffffffffff708;
  LocationRange *in_stack_fffffffffffff710;
  AST *in_stack_fffffffffffff718;
  AST *in_stack_fffffffffffff720;
  LocationRange *in_stack_fffffffffffff728;
  Desugarer *in_stack_fffffffffffff730;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff738;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff740;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff748;
  void **in_stack_fffffffffffff750;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff758;
  void **in_stack_fffffffffffff760;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff768;
  long local_890;
  Object *local_880;
  long local_870;
  long local_860;
  long local_850;
  long local_840;
  long local_830;
  undefined1 **local_7e8;
  long local_7b0;
  pointer local_7a0;
  Allocator *local_790;
  Desugarer *local_780;
  undefined8 local_770;
  long local_760;
  undefined8 local_750;
  long local_740;
  long local_730;
  long local_720;
  long local_6e0;
  long local_6d0;
  long local_6c0;
  undefined1 **local_670;
  pointer local_640;
  long local_620;
  long local_610;
  long local_600;
  long local_5f0;
  long local_5e0;
  _Self local_590;
  _Self local_588;
  ObjectFields *local_580;
  reference local_578;
  Field *local_570;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  local_568;
  undefined8 in_stack_fffffffffffffaa0;
  uint obj_level_00;
  Desugarer *in_stack_fffffffffffffab0;
  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
  local_510;
  long local_508;
  reference local_500;
  Bind *local_4f8;
  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
  local_4f0;
  long local_4e8;
  long local_4e0;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_4d3 [4];
  undefined1 local_470 [88];
  undefined1 local_418 [88];
  undefined1 local_3c0 [88];
  undefined1 *local_368;
  undefined8 local_360;
  _func_int **local_340;
  string local_338;
  UString *in_stack_fffffffffffffcf0;
  LocationRange *in_stack_fffffffffffffcf8;
  ObjectComprehension *in_stack_fffffffffffffd28;
  Allocator *pAVar19;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_233 [4];
  undefined1 local_1d0 [88];
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_150 [80];
  Index *local_100;
  byte local_f1;
  pointer local_f0;
  Error *local_e8;
  long local_a8;
  reference local_a0;
  ComprehensionSpec *local_98;
  __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_90;
  long local_88;
  long local_80;
  reference local_78;
  Element *local_70;
  __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
  local_68;
  long local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  reference local_40;
  ArgParam *local_38;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_30;
  long local_28;
  uint uVar20;
  uint uVar21;
  undefined4 in_stack_ffffffffffffffe8;
  
  obj_level_00 = (uint)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  if (in_RSI->alloc == (Allocator *)0x0) {
    local_5e0 = 0;
  }
  else {
    local_5e0 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Apply::typeinfo,0);
  }
  if (local_5e0 == 0) {
    if (in_RSI->alloc == (Allocator *)0x0) {
      local_5f0 = 0;
    }
    else {
      local_5f0 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    uVar20 = (uint)((ulong)local_5e0 >> 0x20);
    local_48 = local_5f0;
    if (local_5f0 == 0) {
      if (in_RSI->alloc == (Allocator *)0x0) {
        local_600 = 0;
      }
      else {
        local_600 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Array::typeinfo,0);
      }
      local_58 = local_600;
      if (local_600 == 0) {
        if (in_RSI->alloc == (Allocator *)0x0) {
          local_610 = 0;
        }
        else {
          local_610 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
        }
        local_80 = local_610;
        if (local_610 == 0) {
          if (in_RSI->alloc == (Allocator *)0x0) {
            local_620 = 0;
          }
          else {
            local_620 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Assert::typeinfo,0);
          }
          uVar20 = (uint)((ulong)local_5e0 >> 0x20);
          local_a8 = local_620;
          if (local_620 == 0) {
            if (in_RSI->alloc == (Allocator *)0x0) {
              local_640 = (pointer)0x0;
            }
            else {
              local_640 = (pointer)__dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Binary::typeinfo,0);
            }
            uVar20 = (uint)((ulong)local_5e0 >> 0x20);
            local_f0 = local_640;
            if (local_640 == (pointer)0x0) {
              if (in_RSI->alloc == (Allocator *)0x0) {
                local_6c0 = 0;
              }
              else {
                local_6c0 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&BuiltinFunction::typeinfo,0
                                          );
              }
              if (local_6c0 == 0) {
                if (in_RSI->alloc == (Allocator *)0x0) {
                  local_6d0 = 0;
                }
                else {
                  local_6d0 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Conditional::typeinfo,0);
                }
                uVar20 = (uint)((ulong)local_5e0 >> 0x20);
                if (local_6d0 == 0) {
                  if (in_RSI->alloc == (Allocator *)0x0) {
                    local_6e0 = 0;
                  }
                  else {
                    local_6e0 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Dollar::typeinfo,0);
                  }
                  if (local_6e0 == 0) {
                    if (in_RSI->alloc == (Allocator *)0x0) {
                      local_720 = 0;
                    }
                    else {
                      local_720 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Error::typeinfo,0);
                    }
                    if (local_720 == 0) {
                      if (in_RSI->alloc == (Allocator *)0x0) {
                        local_730 = 0;
                      }
                      else {
                        local_730 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Function::typeinfo,
                                                   0);
                      }
                      if (local_730 == 0) {
                        if (in_RSI->alloc == (Allocator *)0x0) {
                          local_740 = 0;
                        }
                        else {
                          local_740 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,&Import::typeinfo,
                                                     0);
                        }
                        if (local_740 == 0) {
                          if (in_RSI->alloc == (Allocator *)0x0) {
                            local_760 = 0;
                          }
                          else {
                            local_760 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                       &Importstr::typeinfo,0);
                          }
                          if (local_760 == 0) {
                            if (in_RSI->alloc == (Allocator *)0x0) {
                              local_780 = (Desugarer *)0x0;
                            }
                            else {
                              local_780 = (Desugarer *)
                                          __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                         &Importbin::typeinfo,0);
                            }
                            if (local_780 == (Desugarer *)0x0) {
                              if (in_RSI->alloc == (Allocator *)0x0) {
                                local_7a0 = (pointer)0x0;
                              }
                              else {
                                local_7a0 = (pointer)__dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                                    &InSuper::typeinfo,0);
                              }
                              if (local_7a0 == (pointer)0x0) {
                                if (in_RSI->alloc == (Allocator *)0x0) {
                                  local_7b0 = 0;
                                }
                                else {
                                  local_7b0 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                             &Index::typeinfo,0);
                                }
                                uVar20 = (uint)((ulong)local_7a0 >> 0x20);
                                uVar21 = (uint)((ulong)local_5e0 >> 0x20);
                                if (local_7b0 == 0) {
                                  if (in_RSI->alloc == (Allocator *)0x0) {
                                    local_830 = 0;
                                  }
                                  else {
                                    local_830 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                               &Local::typeinfo,0);
                                  }
                                  local_4e0 = local_830;
                                  if (local_830 == 0) {
                                    if (in_RSI->alloc == (Allocator *)0x0) {
                                      local_840 = 0;
                                    }
                                    else {
                                      local_840 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                                 &LiteralBoolean::typeinfo,0);
                                    }
                                    if (local_840 == 0) {
                                      if (in_RSI->alloc == (Allocator *)0x0) {
                                        local_850 = 0;
                                      }
                                      else {
                                        local_850 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                                   &LiteralNumber::typeinfo,0);
                                      }
                                      if (local_850 == 0) {
                                        if (in_RSI->alloc == (Allocator *)0x0) {
                                          local_860 = 0;
                                        }
                                        else {
                                          local_860 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                                     &LiteralString::typeinfo,0);
                                        }
                                        if (local_860 == 0) {
                                          if (in_RSI->alloc == (Allocator *)0x0) {
                                            local_870 = 0;
                                          }
                                          else {
                                            local_870 = __dynamic_cast(in_RSI->alloc,&AST::typeinfo,
                                                                       &LiteralNull::typeinfo,0);
                                          }
                                          if (local_870 == 0) {
                                            if (in_RSI->alloc == (Allocator *)0x0) {
                                              local_880 = (Object *)0x0;
                                            }
                                            else {
                                              local_880 = (Object *)
                                                          __dynamic_cast(in_RSI->alloc,
                                                                         &AST::typeinfo,
                                                                         &DesugaredObject::typeinfo,
                                                                         0);
                                            }
                                            uVar21 = (uint)((ulong)local_5e0 >> 0x20);
                                            if (local_880 == (Object *)0x0) {
                                              if (in_RSI->alloc == (Allocator *)0x0) {
                                                local_890 = 0;
                                              }
                                              else {
                                                local_890 = __dynamic_cast(in_RSI->alloc,
                                                                           &AST::typeinfo,
                                                                           &Object::typeinfo,0);
                                              }
                                              if (local_890 == 0) {
                                                if (in_RSI->alloc == (Allocator *)0x0) {
                                                  lVar15 = 0;
                                                }
                                                else {
                                                  lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                          &AST::typeinfo,
                                                                          &ObjectComprehension::
                                                                           typeinfo,0);
                                                }
                                                if (lVar15 == 0) {
                                                  if (in_RSI->alloc == (Allocator *)0x0) {
                                                    lVar15 = 0;
                                                  }
                                                  else {
                                                    lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                            &AST::typeinfo,
                                                                            &
                                                  ObjectComprehensionSimple::typeinfo,0);
                                                  }
                                                  if (lVar15 == 0) {
                                                    if (in_RSI->alloc == (Allocator *)0x0) {
                                                      lVar15 = 0;
                                                    }
                                                    else {
                                                      lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                              &AST::typeinfo,
                                                                              &Parens::typeinfo,0);
                                                    }
                                                    if (lVar15 == 0) {
                                                      if (in_RSI->alloc == (Allocator *)0x0) {
                                                        lVar15 = 0;
                                                      }
                                                      else {
                                                        lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                                &AST::typeinfo,
                                                                                &Self::typeinfo,0);
                                                      }
                                                      if (lVar15 == 0) {
                                                        if (in_RSI->alloc == (Allocator *)0x0) {
                                                          lVar15 = 0;
                                                        }
                                                        else {
                                                          lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                                  &AST::typeinfo,
                                                                                  &SuperIndex::
                                                                                   typeinfo,0);
                                                        }
                                                        if (lVar15 == 0) {
                                                          if (in_RSI->alloc == (Allocator *)0x0) {
                                                            lVar15 = 0;
                                                          }
                                                          else {
                                                            lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                                    &AST::typeinfo,
                                                                                    &Unary::typeinfo
                                                                                    ,0);
                                                          }
                                                          if (lVar15 == 0) {
                                                            if (in_RSI->alloc == (Allocator *)0x0) {
                                                              lVar15 = 0;
                                                            }
                                                            else {
                                                              lVar15 = __dynamic_cast(in_RSI->alloc,
                                                                                      &AST::typeinfo
                                                                                      ,&Var::
                                                  typeinfo,0);
                                                  }
                                                  if (lVar15 == 0) {
                                                    this_00 = ::std::operator<<((ostream *)
                                                                                &::std::cerr,
                                                                                                                                                                
                                                  "INTERNAL ERROR: Unknown AST: ");
                                                  this_01 = (void *)::std::ostream::operator<<
                                                                              (this_00,in_RSI->alloc
                                                                              );
                                                  ::std::ostream::operator<<
                                                            (this_01,::std::
                                                  endl<char,std::char_traits<char>>);
                                                  abort();
                                                  }
                                                  }
                                                  else {
                                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),uVar21);
                                                  }
                                                  }
                                                  else {
                                                    if (*(long *)(lVar15 + 0xb8) != 0) {
                                                      if (*(long *)(lVar15 + 0x98) != 0) {
                                                        __assert_fail("ast->index == nullptr",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                                                  ,0x386,
                                                  "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)"
                                                  );
                                                  }
                                                  pLVar5 = str((Desugarer *)
                                                               in_stack_fffffffffffff6e0,
                                                               (UString *)in_stack_fffffffffffff6d8)
                                                  ;
                                                  *(LiteralString **)(lVar15 + 0x98) = pLVar5;
                                                  *(undefined8 *)(lVar15 + 0xb8) = 0;
                                                  }
                                                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),uVar21);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),uVar21);
                                                  in_RSI->alloc = *(Allocator **)(lVar15 + 0x80);
                                                  }
                                                  }
                                                  else {
                                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),uVar21);
                                                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),uVar21);
                                                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),uVar21);
                                                  }
                                                }
                                                else {
                                                  pAVar4 = makeObjectComprehension
                                                                     (local_780,
                                                                      in_stack_fffffffffffffd28,
                                                                      uVar20);
                                                  in_RSI->alloc = (Allocator *)pAVar4;
                                                }
                                              }
                                              else {
                                                pAVar4 = makeObject(in_stack_fffffffffffffab0,
                                                                    local_880,obj_level_00);
                                                in_RSI->alloc = (Allocator *)pAVar4;
                                              }
                                            }
                                            else {
                                              local_568._M_current =
                                                   (Field *)::std::
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  ::begin((
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  *)in_stack_fffffffffffff6c8);
                                              local_570 = (Field *)::std::
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  ::end((
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  *)in_stack_fffffffffffff6c8);
                                              while (bVar2 = __gnu_cxx::operator!=
                                                                       ((
                                                  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  *)in_stack_fffffffffffff6d0,
                                                  (
                                                  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  *)in_stack_fffffffffffff6c8), bVar2) {
                                                local_578 = __gnu_cxx::
                                                                                                                        
                                                  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  ::operator*(&local_568);
                                                desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),
                                                  (uint)((ulong)local_5e0 >> 0x20));
                                                desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),
                                                  (uint)((ulong)local_5e0 >> 0x20));
                                                __gnu_cxx::
                                                __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                ::operator++(&local_568);
                                              }
                                              local_580 = &local_880->fields;
                                              local_588._M_node =
                                                   (_List_node_base *)
                                                   ::std::__cxx11::
                                                                                                      
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  ::begin((
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  *)in_stack_fffffffffffff6c8);
                                              local_590._M_node =
                                                   (_List_node_base *)
                                                   ::std::__cxx11::
                                                                                                      
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  ::end((
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  *)in_stack_fffffffffffff6c8);
                                              while (bVar2 = ::std::operator!=(&local_588,&local_590
                                                                              ), bVar2) {
                                                ::std::_List_iterator<jsonnet::internal::AST_*>::
                                                operator*((_List_iterator<jsonnet::internal::AST_*>
                                                           *)in_stack_fffffffffffff6d0);
                                                desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),
                                                  (uint)((ulong)local_5e0 >> 0x20));
                                                ::std::_List_iterator<jsonnet::internal::AST_*>::
                                                operator++(&local_588);
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          if ((((*(int *)(local_860 + 0xa0) != 5) &&
                                               (*(int *)(local_860 + 0xa0) != 2)) &&
                                              (*(int *)(local_860 + 0xa0) != 4)) &&
                                             (*(int *)(local_860 + 0xa0) != 3)) {
                                            jsonnet_string_unescape
                                                      (in_stack_fffffffffffffcf8,
                                                       in_stack_fffffffffffffcf0);
                                            ::std::__cxx11::
                                            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                            ::operator=(in_stack_fffffffffffff740,
                                                        in_stack_fffffffffffff738);
                                            ::std::__cxx11::u32string::~u32string
                                                      (in_stack_fffffffffffff6d0);
                                          }
                                          *(undefined4 *)(local_860 + 0xa0) = 5;
                                          ::std::__cxx11::string::clear();
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    local_4e8 = local_830 + 0x80;
                                    local_4f0._M_current =
                                         (Bind *)::std::
                                                 vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                 ::begin((
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  *)in_stack_fffffffffffff6c8);
                                    local_4f8 = (Bind *)::std::
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  ::end((
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  *)in_stack_fffffffffffff6c8);
                                    while (bVar2 = __gnu_cxx::operator!=
                                                             ((
                                                  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  *)in_stack_fffffffffffff6d0,
                                                  (
                                                  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  *)in_stack_fffffffffffff6c8), bVar2) {
                                      local_500 = __gnu_cxx::
                                                  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  ::operator*(&local_4f0);
                                      desugar(in_RSI,(AST **)CONCAT44(in_EDX,
                                                  in_stack_ffffffffffffffe8),
                                              (uint)((ulong)local_5e0 >> 0x20));
                                      __gnu_cxx::
                                      __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                      ::operator++(&local_4f0);
                                    }
                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8
                                                                   ),
                                            (uint)((ulong)local_5e0 >> 0x20));
                                    local_508 = local_4e0 + 0x80;
                                    local_510._M_current =
                                         (Bind *)::std::
                                                 vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                 ::begin((
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  *)in_stack_fffffffffffff6c8);
                                    ::std::
                                    vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                    ::end((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                           *)in_stack_fffffffffffff6c8);
                                    while (bVar2 = __gnu_cxx::operator!=
                                                             ((
                                                  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  *)in_stack_fffffffffffff6d0,
                                                  (
                                                  __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  *)in_stack_fffffffffffff6c8), bVar2) {
                                      pBVar13 = __gnu_cxx::
                                                __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                ::operator*(&local_510);
                                      if ((pBVar13->functionSugar & 1U) != 0) {
                                        desugarParams((Desugarer *)in_stack_fffffffffffff700,
                                                      (ArgParams *)in_stack_fffffffffffff6f8,
                                                      (uint)((ulong)in_stack_fffffffffffff6f0 >>
                                                            0x20));
                                        in_stack_fffffffffffff6c8 =
                                             (UString *)&pBVar13->parenRightFodder;
                                        in_stack_fffffffffffff6d0 =
                                             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                              *)&pBVar13->body;
                                        pFVar14 = make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                                                            ((Desugarer *)in_stack_fffffffffffff700,
                                                             in_stack_fffffffffffff6f8,
                                                             (
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)in_stack_fffffffffffff6f0,
                                                  (
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)in_stack_fffffffffffff6e8,
                                                  (
                                                  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                                  *)in_stack_fffffffffffff6e0,
                                                  (bool *)in_stack_fffffffffffff6d8,
                                                  (
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)in_stack_fffffffffffff710,
                                                  (AST **)in_stack_fffffffffffff718);
                                        pBVar13->body = &pFVar14->super_AST;
                                        pBVar13->functionSugar = false;
                                        ::std::
                                        vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                        ::clear((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                                 *)0x353de1);
                                      }
                                      __gnu_cxx::
                                      __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                      ::operator++(&local_510);
                                    }
                                  }
                                }
                                else {
                                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                          uVar21);
                                  if ((*(byte *)(local_7b0 + 0xa0) & 1) == 0) {
                                    if (*(long *)(local_7b0 + 0x108) != 0) {
                                      if (*(long *)(local_7b0 + 0xa8) != 0) {
                                        __assert_fail("ast->index == nullptr",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                                                  ,0x33a,
                                                  "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)"
                                                  );
                                      }
                                      pLVar5 = str((Desugarer *)in_stack_fffffffffffff6e0,
                                                   (UString *)in_stack_fffffffffffff6d8);
                                      *(LiteralString **)(local_7b0 + 0xa8) = pLVar5;
                                      *(undefined8 *)(local_7b0 + 0x108) = 0;
                                    }
                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8
                                                                   ),uVar21);
                                  }
                                  else {
                                    if (*(long *)(local_7b0 + 0xa8) == 0) {
                                      pLVar10 = null((Desugarer *)0x353552);
                                      *(LiteralNull **)(local_7b0 + 0xa8) = pLVar10;
                                    }
                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8
                                                                   ),uVar21);
                                    if (*(long *)(local_7b0 + 200) == 0) {
                                      pLVar10 = null((Desugarer *)0x3535a6);
                                      *(LiteralNull **)(local_7b0 + 200) = pLVar10;
                                    }
                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8
                                                                   ),uVar21);
                                    if (*(long *)(local_7b0 + 0xe8) == 0) {
                                      pLVar10 = null((Desugarer *)0x3535fa);
                                      *(LiteralNull **)(local_7b0 + 0xe8) = pLVar10;
                                    }
                                    desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8
                                                                   ),uVar21);
                                    std((Desugarer *)in_stack_fffffffffffff720);
                                    ::std::allocator<char32_t>::allocator
                                              ((allocator<char32_t> *)0x353675);
                                    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                                              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                *)in_stack_fffffffffffff710,
                                               (char32_t *)in_stack_fffffffffffff708,
                                               (allocator<char32_t> *)in_stack_fffffffffffff700);
                                    str((Desugarer *)in_stack_fffffffffffff6e0,
                                        (UString *)in_stack_fffffffffffff6d8);
                                    local_338._M_dataplus = (_Alloc_hider)0x0;
                                    local_338._1_7_ = 0;
                                    local_340 = (_func_int **)0x0;
                                    puVar17 = EF;
                                    pAVar4 = (AST *)&local_340;
                                    puVar16 = EF;
                                    make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                              ((Desugarer *)in_stack_fffffffffffff718,
                                               in_stack_fffffffffffff710,
                                               &in_stack_fffffffffffff708->idFodder,
                                               (Var **)in_stack_fffffffffffff700,
                                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                *)in_stack_fffffffffffff6f8,(bool *)EF,
                                               (LiteralString **)in_stack_fffffffffffff740,
                                               in_stack_fffffffffffff748,in_stack_fffffffffffff750,
                                               in_stack_fffffffffffff758,in_stack_fffffffffffff760,
                                               in_stack_fffffffffffff768);
                                    local_4d3[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._3_8_ =
                                         (long)&local_4d3[0].
                                                super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                                ._M_impl.super__Vector_impl_data._M_finish + 3;
                                    ArgParam::ArgParam((ArgParam *)puVar17,pAVar4,(Fodder *)puVar16)
                                    ;
                                    local_4d3[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._3_8_ = local_470;
                                    ArgParam::ArgParam((ArgParam *)puVar17,pAVar4,(Fodder *)puVar16)
                                    ;
                                    local_4d3[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._3_8_ = local_418;
                                    ArgParam::ArgParam((ArgParam *)puVar17,pAVar4,(Fodder *)puVar16)
                                    ;
                                    local_4d3[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._3_8_ = local_3c0;
                                    ArgParam::ArgParam((ArgParam *)puVar17,pAVar4,(Fodder *)puVar16)
                                    ;
                                    local_368 = (undefined1 *)
                                                ((long)&local_4d3[0].
                                                                                                                
                                                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 3);
                                    local_360 = 4;
                                    ::std::allocator<jsonnet::internal::ArgParam>::allocator
                                              ((allocator<jsonnet::internal::ArgParam> *)0x353839);
                                    __l_00._M_len = (size_type)in_stack_fffffffffffff710;
                                    __l_00._M_array = in_stack_fffffffffffff708;
                                    ::std::
                                    vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ::vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                              *)in_stack_fffffffffffff700,__l_00,
                                             (allocator_type *)in_stack_fffffffffffff6f8);
                                    local_4d3[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
                                    local_4d3[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                                    pvVar18 = local_4d3;
                                    puVar16 = EF;
                                    pAVar8 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                                                       ((Desugarer *)in_stack_fffffffffffff708,
                                                        in_stack_fffffffffffff700,
                                                        (
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)in_stack_fffffffffffff6f8,(Index **)puVar17,
                                                  (
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)pAVar4,pvVar18,(bool *)in_stack_fffffffffffff720
                                                  ,(
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)in_stack_fffffffffffff728,
                                                  (
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)in_stack_fffffffffffff730,
                                                  (bool *)in_stack_fffffffffffff738);
                                    in_RSI->alloc = (Allocator *)pAVar8;
                                    ::std::
                                    vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ::~vector(pvVar18);
                                    ::std::allocator<jsonnet::internal::ArgParam>::~allocator
                                              ((allocator<jsonnet::internal::ArgParam> *)0x3538f8);
                                    local_7e8 = &local_368;
                                    do {
                                      local_7e8 = local_7e8 + -0xb;
                                      ArgParam::~ArgParam((ArgParam *)puVar16);
                                    } while (local_7e8 !=
                                             (undefined1 **)
                                             ((long)&local_4d3[0].
                                                                                                          
                                                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 3));
                                    ::std::__cxx11::u32string::~u32string
                                              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                *)puVar16);
                                    ::std::allocator<char32_t>::~allocator
                                              ((allocator<char32_t> *)0x353966);
                                  }
                                }
                              }
                              else {
                                desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                        (uint)((ulong)local_5e0 >> 0x20));
                              }
                            }
                            else {
                              pAVar19 = local_780[8].alloc;
                              desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                      (uint)((ulong)local_5e0 >> 0x20));
                              if (pAVar19 == (Allocator *)0x0) {
                                local_790 = (Allocator *)0x0;
                              }
                              else {
                                local_790 = (Allocator *)
                                            __dynamic_cast(pAVar19,&AST::typeinfo,
                                                           &LiteralString::typeinfo,0);
                              }
                              local_780[8].alloc = local_790;
                            }
                          }
                          else {
                            lVar15 = *(long *)(local_760 + 0x80);
                            desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                    (uint)((ulong)local_5e0 >> 0x20));
                            if (lVar15 == 0) {
                              local_770 = 0;
                            }
                            else {
                              local_770 = __dynamic_cast(lVar15,&AST::typeinfo,
                                                         &LiteralString::typeinfo,0);
                            }
                            *(undefined8 *)(local_760 + 0x80) = local_770;
                          }
                        }
                        else {
                          lVar15 = *(long *)(local_740 + 0x80);
                          desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                  (uint)((ulong)local_5e0 >> 0x20));
                          if (lVar15 == 0) {
                            local_750 = 0;
                          }
                          else {
                            local_750 = __dynamic_cast(lVar15,&AST::typeinfo,
                                                       &LiteralString::typeinfo,0);
                          }
                          *(undefined8 *)(local_740 + 0x80) = local_750;
                        }
                      }
                      else {
                        desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                (uint)((ulong)local_5e0 >> 0x20));
                        desugarParams((Desugarer *)in_stack_fffffffffffff700,
                                      (ArgParams *)in_stack_fffffffffffff6f8,
                                      (uint)((ulong)in_stack_fffffffffffff6f0 >> 0x20));
                      }
                    }
                    else {
                      desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                              (uint)((ulong)local_5e0 >> 0x20));
                    }
                  }
                  else {
                    if (in_EDX == 0) {
                      uVar11 = __cxa_allocate_exception(0x60);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string<std::allocator<char>>
                                (&in_stack_fffffffffffff710->file,(char *)in_stack_fffffffffffff708,
                                 (allocator<char> *)in_stack_fffffffffffff700);
                      StaticError::StaticError
                                (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                                 in_stack_fffffffffffff6e0);
                      __cxa_throw(uVar11,&StaticError::typeinfo,StaticError::~StaticError);
                    }
                    ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x352ecc);
                    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                *)in_stack_fffffffffffff710,(char32_t *)in_stack_fffffffffffff708,
                               (allocator<char32_t> *)in_stack_fffffffffffff700);
                    id((Desugarer *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
                    pVVar12 = var((Desugarer *)in_stack_fffffffffffff6d0,
                                  (Identifier *)in_stack_fffffffffffff6c8);
                    in_RSI->alloc = (Allocator *)pVVar12;
                    ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffff6d0);
                    ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x352f55);
                  }
                }
                else {
                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
                  if (*(long *)(local_6d0 + 0xc0) == 0) {
                    pLVar10 = null((Desugarer *)0x352cf8);
                    *(LiteralNull **)(local_6d0 + 0xc0) = pLVar10;
                  }
                  desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
                }
              }
            }
            else {
              desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
              desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
              local_f1 = 0;
              KVar1 = local_f0[4].kind;
              if (KVar1 == PARAGRAPH) {
                local_150._72_8_ = std((Desugarer *)in_stack_fffffffffffff720);
                local_150[0x47] = 0;
                ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x35271e);
                ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                          ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                            *)in_stack_fffffffffffff710,(char32_t *)in_stack_fffffffffffff708,
                           (allocator<char32_t> *)in_stack_fffffffffffff700);
                local_150._56_8_ =
                     str((Desugarer *)in_stack_fffffffffffff6e0,(UString *)in_stack_fffffffffffff6d8
                        );
                local_150._8_8_ = 0;
                local_150._0_8_ = (_func_int **)0x0;
                this_02 = EF;
                pAVar4 = (AST *)local_150;
                puVar17 = EF;
                puVar16 = EF;
                pIVar7 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                   ((Desugarer *)in_stack_fffffffffffff718,in_stack_fffffffffffff710
                                    ,&in_stack_fffffffffffff708->idFodder,
                                    (Var **)in_stack_fffffffffffff700,
                                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                     *)in_stack_fffffffffffff6f8,(bool *)EF,
                                    (LiteralString **)in_stack_fffffffffffff740,
                                    in_stack_fffffffffffff748,in_stack_fffffffffffff750,
                                    in_stack_fffffffffffff758,in_stack_fffffffffffff760,
                                    in_stack_fffffffffffff768);
                ::std::__cxx11::u32string::~u32string
                          ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                            *)puVar16);
                ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x352807);
                local_233[0].
                super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                ._M_impl.super__Vector_impl_data._3_8_ =
                     (long)&local_233[0].
                            super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 3;
                local_100 = pIVar7;
                ArgParam::ArgParam((ArgParam *)this_02,pAVar4,(Fodder *)puVar17);
                local_233[0].
                super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                ._M_impl.super__Vector_impl_data._3_8_ = local_1d0;
                ArgParam::ArgParam((ArgParam *)this_02,pAVar4,(Fodder *)puVar17);
                local_178 = (undefined1 *)
                            ((long)&local_233[0].
                                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 3);
                local_170 = 2;
                ::std::allocator<jsonnet::internal::ArgParam>::allocator
                          ((allocator<jsonnet::internal::ArgParam> *)0x3528a2);
                __l._M_len = (size_type)in_stack_fffffffffffff710;
                __l._M_array = in_stack_fffffffffffff708;
                ::std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                        *)in_stack_fffffffffffff700,__l,(allocator_type *)in_stack_fffffffffffff6f8)
                ;
                ::std::allocator<jsonnet::internal::ArgParam>::~allocator
                          ((allocator<jsonnet::internal::ArgParam> *)0x3528d6);
                local_670 = &local_178;
                do {
                  local_670 = local_670 + -0xb;
                  ArgParam::~ArgParam((ArgParam *)puVar16);
                } while (local_670 !=
                         (undefined1 **)
                         ((long)&local_233[0].
                                 super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 3));
                local_233[0].
                super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
                local_233[0].
                super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                pvVar18 = local_233;
                pAVar8 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                                   ((Desugarer *)in_stack_fffffffffffff708,in_stack_fffffffffffff700
                                    ,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)in_stack_fffffffffffff6f8,(AST **)this_02,
                                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                     *)pAVar4,pvVar18,(bool *)in_stack_fffffffffffff720,
                                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                     *)in_stack_fffffffffffff728,
                                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                     *)in_stack_fffffffffffff730,(bool *)in_stack_fffffffffffff738);
                in_RSI->alloc = (Allocator *)pAVar8;
                ::std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                ~vector(pvVar18);
              }
              else {
                if (KVar1 != 0xc) {
                  if (KVar1 != 0xd) {
                    return;
                  }
                  local_f1 = 1;
                }
                pAVar8 = equals(in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                                in_stack_fffffffffffff720,in_stack_fffffffffffff718);
                in_RSI->alloc = (Allocator *)pAVar8;
                if ((local_f1 & 1) != 0) {
                  pUVar9 = make<jsonnet::internal::Unary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp,jsonnet::internal::AST*&>
                                     ((Desugarer *)in_stack_fffffffffffff6e0,
                                      in_stack_fffffffffffff6d8,
                                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)in_stack_fffffffffffff6d0,
                                      (UnaryOp *)in_stack_fffffffffffff6c8,(AST **)0x352bae);
                  in_RSI->alloc = (Allocator *)pUVar9;
                }
              }
            }
          }
          else {
            desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
            if (*(long *)(local_a8 + 0xa0) == 0) {
              ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x35244a);
              ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)in_stack_fffffffffffff710,(char32_t *)in_stack_fffffffffffff708,
                         (allocator<char32_t> *)in_stack_fffffffffffff700);
              pLVar5 = str((Desugarer *)in_stack_fffffffffffff6e0,
                           (UString *)in_stack_fffffffffffff6d8);
              *(LiteralString **)(local_a8 + 0xa0) = pLVar5;
              ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffff6d0);
              ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x3524b8);
            }
            desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
            desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
            local_e8 = make<jsonnet::internal::Error,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                                 ((Desugarer *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
                                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                   *)in_stack_fffffffffffff6d0,(AST **)in_stack_fffffffffffff6c8);
            pCVar6 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                               ((Desugarer *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)in_stack_fffffffffffff6f0,(AST **)in_stack_fffffffffffff6e8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)in_stack_fffffffffffff6e0,(AST **)in_stack_fffffffffffff6d8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)in_stack_fffffffffffff710,(AST **)in_stack_fffffffffffff718);
            in_RSI->alloc = (Allocator *)pCVar6;
          }
        }
        else {
          local_88 = local_610 + 0xa8;
          local_90._M_current =
               (ComprehensionSpec *)
               ::std::
               vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
               ::begin((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                        *)in_stack_fffffffffffff6c8);
          local_98 = (ComprehensionSpec *)
                     ::std::
                     vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                     ::end((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                            *)in_stack_fffffffffffff6c8);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                                     *)in_stack_fffffffffffff6d0,
                                    (__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                                     *)in_stack_fffffffffffff6c8), bVar2) {
            local_a0 = __gnu_cxx::
                       __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                       ::operator*(&local_90);
            desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    (uint)((ulong)local_5e0 >> 0x20));
            __gnu_cxx::
            __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
            ::operator++(&local_90);
          }
          desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                  (uint)((ulong)local_5e0 >> 0x20));
          pAVar4 = makeArrayComprehension(in_stack_000002a0,in_stack_00000298);
          in_RSI->alloc = (Allocator *)pAVar4;
        }
      }
      else {
        local_60 = local_600 + 0x80;
        local_68._M_current =
             (Element *)
             ::std::
             vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
             ::begin((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                      *)in_stack_fffffffffffff6c8);
        local_70 = (Element *)
                   ::std::
                   vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   ::end((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                          *)in_stack_fffffffffffff6c8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                                   *)in_stack_fffffffffffff6d0,
                                  (__normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                                   *)in_stack_fffffffffffff6c8), bVar2) {
          local_78 = __gnu_cxx::
                     __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                     ::operator*(&local_68);
          desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                  (uint)((ulong)local_5e0 >> 0x20));
          __gnu_cxx::
          __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
          ::operator++(&local_68);
        }
      }
    }
    else {
      desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
      desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),uVar20);
      local_4c = 3;
      pBVar3 = make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                         ((Desugarer *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff6e0,(AST **)in_stack_fffffffffffff6d8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff6d0,(BinaryOp *)(local_48 + 0x88),
                          (AST **)in_stack_fffffffffffff700);
      in_RSI->alloc = (Allocator *)pBVar3;
    }
  }
  else {
    desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
            (uint)((ulong)local_5e0 >> 0x20));
    local_28 = local_5e0 + 0xa0;
    local_30._M_current =
         (ArgParam *)
         ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
         begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               in_stack_fffffffffffff6c8);
    local_38 = (ArgParam *)
               ::std::
               vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
               end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    *)in_stack_fffffffffffff6c8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff6d0,
                              (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff6c8), bVar2) {
      local_40 = __gnu_cxx::
                 __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                 ::operator*(&local_30);
      desugar(in_RSI,(AST **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
              (uint)((ulong)local_5e0 >> 0x20));
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void desugar(AST *&ast_, unsigned obj_level)
    {
        if (auto *ast = dynamic_cast<Apply *>(ast_)) {
            desugar(ast->target, obj_level);
            for (ArgParam &arg : ast->args)
                desugar(arg.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ApplyBrace *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);
            ast_ =
                make<Binary>(ast->location, ast->openFodder, ast->left, EF, BOP_PLUS, ast->right);

        } else if (auto *ast = dynamic_cast<Array *>(ast_)) {
            for (auto &el : ast->elements)
                desugar(el.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ArrayComprehension *>(ast_)) {
            for (ComprehensionSpec &spec : ast->specs)
                desugar(spec.expr, obj_level);
            desugar(ast->body, obj_level + 1);

            ast_ = makeArrayComprehension(ast);

        } else if (auto *ast = dynamic_cast<Assert *>(ast_)) {
            desugar(ast->cond, obj_level);
            if (ast->message == nullptr) {
                ast->message = str(U"Assertion failed.");
            }
            desugar(ast->message, obj_level);
            desugar(ast->rest, obj_level);

            // if cond then rest else error msg
            AST *branch_false = make<Error>(ast->location, EF, ast->message);
            ast_ = make<Conditional>(
                ast->location, ast->openFodder, ast->cond, EF, ast->rest, EF, branch_false);

        } else if (auto *ast = dynamic_cast<Binary *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);

            bool invert = false;

            switch (ast->op) {
                case BOP_PERCENT: {
                    AST *f_mod = make<Index>(
                        E, EF, std(), EF, false, str(U"mod"), EF, nullptr, EF, nullptr, EF);
                    ArgParams args = {{ast->left, EF}, {ast->right, EF}};
                    ast_ = make<Apply>(
                        ast->location, ast->openFodder, f_mod, EF, args, false, EF, EF, false);
                } break;

                case BOP_MANIFEST_UNEQUAL: invert = true;
                [[fallthrough]];
                case BOP_MANIFEST_EQUAL: {
                    ast_ = equals(ast->location, ast->left, ast->right);
                    if (invert)
                        ast_ = make<Unary>(ast->location, ast->openFodder, UOP_NOT, ast_);
                } break;

                default:;
                    // Otherwise don't change it.
            }

        } else if (dynamic_cast<const BuiltinFunction *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<Conditional *>(ast_)) {
            desugar(ast->cond, obj_level);
            desugar(ast->branchTrue, obj_level);
            if (ast->branchFalse == nullptr)
                ast->branchFalse = null();
            desugar(ast->branchFalse, obj_level);

        } else if (auto *ast = dynamic_cast<Dollar *>(ast_)) {
            if (obj_level == 0) {
                throw StaticError(ast->location, "No top-level object found.");
            }
            ast_ = var(id(U"$"));

        } else if (auto *ast = dynamic_cast<Error *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (auto *ast = dynamic_cast<Function *>(ast_)) {
            desugar(ast->body, obj_level);
            desugarParams(ast->params, obj_level);

        } else if (auto *ast = dynamic_cast<Import *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importstr *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importbin *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<InSuper *>(ast_)) {
            desugar(ast->element, obj_level);

        } else if (auto *ast = dynamic_cast<Index *>(ast_)) {
            desugar(ast->target, obj_level);
            if (ast->isSlice) {
                if (ast->index == nullptr)
                    ast->index = null();
                desugar(ast->index, obj_level);

                if (ast->end == nullptr)
                    ast->end = null();
                desugar(ast->end, obj_level);

                if (ast->step == nullptr)
                    ast->step = null();
                desugar(ast->step, obj_level);

                ast_ = make<Apply>(
                    ast->location,
                    EF,
                    make<Index>(
                        E, EF, std(), EF, false, str(U"slice"), EF, nullptr, EF, nullptr, EF),
                    EF,
                    ArgParams{
                        {ast->target, EF},
                        {ast->index, EF},
                        {ast->end, EF},
                        {ast->step, EF},
                    },
                    false,  // trailing comma
                    EF,
                    EF,
                    false  // tailstrict
                );
            } else {
                if (ast->id != nullptr) {
                    assert(ast->index == nullptr);
                    ast->index = str(ast->id->name);
                    ast->id = nullptr;
                }
                desugar(ast->index, obj_level);
            }

        } else if (auto *ast = dynamic_cast<Local *>(ast_)) {
            for (auto &bind : ast->binds)
                desugar(bind.body, obj_level);
            desugar(ast->body, obj_level);

            for (auto &bind : ast->binds) {
                if (bind.functionSugar) {
                    desugarParams(bind.params, obj_level);
                    bind.body = make<Function>(ast->location,
                                               ast->openFodder,
                                               bind.parenLeftFodder,
                                               bind.params,
                                               false,
                                               bind.parenRightFodder,
                                               bind.body);
                    bind.functionSugar = false;
                    bind.params.clear();
                }
            }

        } else if (dynamic_cast<const LiteralBoolean *>(ast_)) {
            // Nothing to do.

        } else if (dynamic_cast<const LiteralNumber *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<LiteralString *>(ast_)) {
            if ((ast->tokenKind != LiteralString::RAW_DESUGARED) &&
                (ast->tokenKind != LiteralString::BLOCK) &&
                (ast->tokenKind != LiteralString::VERBATIM_DOUBLE) &&
                (ast->tokenKind != LiteralString::VERBATIM_SINGLE)) {
                ast->value = jsonnet_string_unescape(ast->location, ast->value);
            }
            ast->tokenKind = LiteralString::RAW_DESUGARED;
            ast->blockIndent.clear();

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<DesugaredObject *>(ast_)) {
            for (auto &field : ast->fields) {
                desugar(field.name, obj_level);
                desugar(field.body, obj_level + 1);
            }
            for (AST *assert : ast->asserts) {
                desugar(assert, obj_level + 1);
            }

        } else if (auto *ast = dynamic_cast<Object *>(ast_)) {
            ast_ = makeObject(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehension *>(ast_)) {
            ast_ = makeObjectComprehension(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehensionSimple *>(ast_)) {
            desugar(ast->field, obj_level);
            desugar(ast->value, obj_level + 1);
            desugar(ast->array, obj_level);

        } else if (auto *ast = dynamic_cast<Parens *>(ast_)) {
            // Strip parens.
            desugar(ast->expr, obj_level);
            ast_ = ast->expr;

        } else if (dynamic_cast<const Self *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<SuperIndex *>(ast_)) {
            if (ast->id != nullptr) {
                assert(ast->index == nullptr);
                ast->index = str(ast->id->name);
                ast->id = nullptr;
            }
            desugar(ast->index, obj_level);

        } else if (auto *ast = dynamic_cast<Unary *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (dynamic_cast<const Var *>(ast_)) {
            // Nothing to do.

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }